

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::DistExpression::DistItem>::
emplaceRealloc<slang::ast::DistExpression::DistItem&>
          (SmallVectorBase<slang::ast::DistExpression::DistItem> *this,pointer pos,DistItem *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  Expression *pEVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined7 uVar7;
  pointer pDVar8;
  pointer pDVar9;
  size_type sVar10;
  pointer pDVar11;
  long lVar12;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar2 = this->cap;
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar12 = (long)pos - (long)this->data_;
  pDVar8 = (pointer)detail::allocArray(capacity,0x20);
  pEVar3 = args->value;
  uVar4 = *(undefined8 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload;
  uVar5 = *(undefined8 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_engaged;
  puVar1 = (undefined8 *)((long)pDVar8 + lVar12 + 0x10);
  *puVar1 = (args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload._M_value.expr;
  puVar1[1] = uVar5;
  *(undefined8 *)((long)pDVar8 + lVar12) = pEVar3;
  ((undefined8 *)((long)pDVar8 + lVar12))[1] = uVar4;
  pDVar9 = this->data_;
  sVar10 = this->len;
  if (pDVar9 + sVar10 == pos) {
    pDVar11 = pDVar8;
    if (sVar10 != 0) {
      do {
        pEVar3 = pDVar9->value;
        uVar4 = *(undefined8 *)
                 &(pDVar9->weight).
                  super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                  _M_payload;
        bVar6 = (pDVar9->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
        uVar7 = *(undefined7 *)
                 &(pDVar9->weight).
                  super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                  field_0x11;
        (pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
        _M_value.expr =
             (pDVar9->weight).
             super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
             _M_value.expr;
        (pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
             bVar6;
        *(undefined7 *)
         &(pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>
          ._M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
          field_0x11 = uVar7;
        pDVar11->value = pEVar3;
        *(undefined8 *)
         &(pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>
          ._M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
          _M_payload = uVar4;
        pDVar9 = pDVar9 + 1;
        pDVar11 = pDVar11 + 1;
      } while (pDVar9 != pos);
    }
  }
  else {
    pDVar11 = pDVar8;
    if (pDVar9 != pos) {
      do {
        pEVar3 = pDVar9->value;
        uVar4 = *(undefined8 *)
                 &(pDVar9->weight).
                  super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                  _M_payload;
        bVar6 = (pDVar9->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
        uVar7 = *(undefined7 *)
                 &(pDVar9->weight).
                  super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                  field_0x11;
        (pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
        _M_value.expr =
             (pDVar9->weight).
             super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
             _M_value.expr;
        (pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
             bVar6;
        *(undefined7 *)
         &(pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>
          ._M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
          field_0x11 = uVar7;
        pDVar11->value = pEVar3;
        *(undefined8 *)
         &(pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>
          ._M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
          _M_payload = uVar4;
        pDVar9 = pDVar9 + 1;
        pDVar11 = pDVar11 + 1;
      } while (pDVar9 != pos);
      pDVar9 = this->data_;
      sVar10 = this->len;
    }
    if (pDVar9 + sVar10 != pos) {
      puVar1 = (undefined8 *)((long)pDVar8 + lVar12);
      do {
        pEVar3 = pos->value;
        uVar4 = *(undefined8 *)
                 &(pos->weight).
                  super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                  _M_payload;
        uVar5 = *(undefined8 *)
                 &(pos->weight).
                  super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                  _M_engaged;
        puVar1[6] = (pos->weight).
                    super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                    _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                    _M_payload._M_value.expr;
        puVar1[7] = uVar5;
        puVar1[4] = pEVar3;
        puVar1[5] = uVar4;
        pos = pos + 1;
        puVar1 = puVar1 + 4;
      } while (pos != pDVar9 + sVar10);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pDVar8;
  return (pointer)((long)pDVar8 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}